

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

int firstpass_intra_prediction
              (AV1_COMP *cpi,ThreadData_conflict *td,YV12_BUFFER_CONFIG *this_frame,TileInfo *tile,
              int unit_row,int unit_col,int y_offset,int uv_offset,BLOCK_SIZE fp_block_size,
              int qindex,FRAME_STATS *stats)

{
  byte bVar1;
  BLOCK_SIZE BVar2;
  int iVar3;
  uint uVar4;
  SequenceHeader *seq_params_00;
  MACROBLOCKD *xd_00;
  int64_t iVar5;
  TileInfo *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar6;
  int unaff_retaddr;
  BLOCK_SIZE unaff_retaddr_00;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  uint8_t *buf;
  int in_stack_00000020;
  int num_8x8_cols;
  int num_8x8_rows;
  int stride;
  int hbd;
  int level_sample;
  double log_intra;
  int this_intra_error;
  BLOCK_SIZE bsize;
  int num_planes;
  int unit_scale;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  SequenceHeader *seq_params;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff60;
  int mi_cols;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  CommonModeInfoParams *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint local_68;
  long lVar7;
  MACROBLOCK *x_00;
  undefined4 in_stack_fffffffffffffffc;
  undefined2 uVar8;
  
  uVar8 = (undefined2)((uint)in_stack_fffffffffffffffc >> 0x10);
  seq_params_00 = (SequenceHeader *)(in_RDI + 0x3c188);
  x_00 = *(MACROBLOCK **)(in_RDI + 0x42008);
  xd_00 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [(BLOCK_SIZE)buf];
  lVar7 = in_RSI;
  iVar3 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
  BVar2 = get_bsize((CommonModeInfoParams *)seq_params_00,(BLOCK_SIZE)buf,in_R8D,in_R9D);
  set_mi_offsets(in_stack_ffffffffffffff70,
                 (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
  *(long *)(in_RSI + 0x1c0) = *(long *)(in_RDX + 0x28) + (long)in_stack_00000008;
  if (1 < iVar3) {
    *(long *)(in_RSI + 0xbf0) = *(long *)(in_RDX + 0x30) + (long)in_stack_00000010;
    *(long *)(in_RSI + 0x1620) = *(long *)(in_RDX + 0x38) + (long)in_stack_00000010;
  }
  *(bool *)(in_RSI + 0x2061) = in_R9D != 0;
  *(BLOCK_SIZE *)**(undefined8 **)(in_RSI + 0x2058) = BVar2;
  *(undefined1 *)(**(long **)(in_RSI + 0x2058) + 0x10) = 0;
  mi_cols = *(int *)&seq_params_00->frame_id_numbers_present_flag;
  set_mi_row_col(xd_00,in_RCX,in_R8D * (uint)bVar1,
                 (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [BVar2],in_R9D * (uint)bVar1,
                 (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [BVar2],seq_params_00->max_frame_height,mi_cols);
  set_plane_n4(xd_00,(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [BVar2],
               (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [BVar2],iVar3);
  *(ushort *)(**(long **)(in_RSI + 0x2058) + 0xa7) =
       *(ushort *)(**(long **)(in_RSI + 0x2058) + 0xa7) & 0xfff8;
  *(uint *)(in_RSI + 0x2b64 +
           (ulong)((byte)*(undefined2 *)(**(long **)(in_RSI + 0x2058) + 0xa7) & 7) * 4) =
       (uint)(in_stack_00000020 == 0);
  *(undefined1 *)(**(long **)(in_RSI + 0x2058) + 2) = 0;
  *(undefined1 *)(**(long **)(in_RSI + 0x2058) + 0x91) = 0;
  if (*(int *)(in_RDI + 0x608fc) == 0) {
    av1_encode_intra_block_plane
              ((AV1_COMP *)CONCAT44(in_stack_00000014,in_stack_00000010),
               (MACROBLOCK *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
               unaff_retaddr,(RUN_TYPE)((ushort)uVar8 >> 8),(TRELLIS_OPT_TYPE)uVar8);
  }
  else {
    first_pass_predict_intra_block_for_luma_plane
              (seq_params_00,x_00,(BLOCK_SIZE)((ulong)lVar7 >> 0x38));
  }
  local_68 = aom_get_mb_ss_sse2((int16_t *)
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if ((x_00->plane[0].src.field_0x1c != '\0') &&
     (in_stack_ffffffffffffff6c = x_00->plane[0].src.stride, in_stack_ffffffffffffff6c != 8)) {
    if (in_stack_ffffffffffffff6c == 10) {
      local_68 = (int)local_68 >> 4;
    }
    else {
      if (in_stack_ffffffffffffff6c != 0xc) {
        return -1;
      }
      local_68 = (int)local_68 >> 8;
    }
  }
  if ((int)local_68 < 0x32) {
    *(int *)(_num_8x8_rows + 7) = (int)_num_8x8_rows[7] + 1;
  }
  else if ((0 < in_R9D) && (*(int *)((long)_num_8x8_rows + 0x3c) == -1)) {
    *(int *)((long)_num_8x8_rows + 0x3c) = in_R8D;
  }
  dVar6 = log1p((double)(int)local_68);
  if (10.0 <= dVar6) {
    _num_8x8_rows[0xd] = (long)((double)_num_8x8_rows[0xd] + 1.0);
  }
  else {
    _num_8x8_rows[0xd] = (long)((10.0 - dVar6) * 0.05 + 1.0 + (double)_num_8x8_rows[0xd]);
  }
  if (x_00->plane[0].src.field_0x1c == '\0') {
    uVar4 = (uint)**(byte **)(lVar7 + 0x30);
  }
  else {
    uVar4 = (uint)*(ushort *)(*(long *)(lVar7 + 0x30) << 1);
  }
  if ((x_00->plane[0].src.field_0x1c != '\0') &&
     (in_stack_ffffffffffffff68 = x_00->plane[0].src.stride, in_stack_ffffffffffffff68 != 8)) {
    if (in_stack_ffffffffffffff68 == 10) {
      uVar4 = (int)uVar4 >> 2;
    }
    else {
      if (in_stack_ffffffffffffff68 != 0xc) {
        return -1;
      }
      uVar4 = (int)uVar4 >> 4;
    }
  }
  if ((0x3f < uVar4) || (9.0 <= dVar6)) {
    _num_8x8_rows[0xe] = (long)((double)_num_8x8_rows[0xe] + 1.0);
  }
  else {
    _num_8x8_rows[0xe] =
         (long)((double)(int)(0x40 - uVar4) * 0.01 + 1.0 + (double)_num_8x8_rows[0xe]);
  }
  *_num_8x8_rows = (long)(int)(local_68 + 0x400) + *_num_8x8_rows;
  iVar3 = calc_wavelet_energy((AV1EncoderConfig *)(in_RDI + 0x42320));
  if (iVar3 == 0) {
    _num_8x8_rows[1] = -1;
  }
  else {
    is_cur_buf_hbd(xd_00);
    iVar5 = av1_haar_ac_sad_mxn_uint8_input
                      (*(uint8_t **)(lVar7 + 0x30),in_stack_ffffffffffffff6c,
                       in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,mi_cols);
    _num_8x8_rows[1] = iVar5 + _num_8x8_rows[1];
  }
  return local_68 + 0x400;
}

Assistant:

static int firstpass_intra_prediction(
    AV1_COMP *cpi, ThreadData *td, YV12_BUFFER_CONFIG *const this_frame,
    const TileInfo *const tile, const int unit_row, const int unit_col,
    const int y_offset, const int uv_offset, const BLOCK_SIZE fp_block_size,
    const int qindex, FRAME_STATS *const stats) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const SequenceHeader *const seq_params = cm->seq_params;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const int unit_scale = mi_size_wide[fp_block_size];
  const int num_planes = av1_num_planes(cm);
  const BLOCK_SIZE bsize =
      get_bsize(mi_params, fp_block_size, unit_row, unit_col);

  set_mi_offsets(mi_params, xd, unit_row * unit_scale, unit_col * unit_scale);
  xd->plane[0].dst.buf = this_frame->y_buffer + y_offset;
  if (num_planes > 1) {
    xd->plane[1].dst.buf = this_frame->u_buffer + uv_offset;
    xd->plane[2].dst.buf = this_frame->v_buffer + uv_offset;
  }
  xd->left_available = (unit_col != 0);
  xd->mi[0]->bsize = bsize;
  xd->mi[0]->ref_frame[0] = INTRA_FRAME;
  set_mi_row_col(xd, tile, unit_row * unit_scale, mi_size_high[bsize],
                 unit_col * unit_scale, mi_size_wide[bsize], mi_params->mi_rows,
                 mi_params->mi_cols);
  set_plane_n4(xd, mi_size_wide[bsize], mi_size_high[bsize], num_planes);
  xd->mi[0]->segment_id = 0;
  xd->lossless[xd->mi[0]->segment_id] = (qindex == 0);
  xd->mi[0]->mode = DC_PRED;
  xd->mi[0]->tx_size = TX_4X4;

  if (cpi->sf.fp_sf.disable_recon)
    first_pass_predict_intra_block_for_luma_plane(seq_params, x, bsize);
  else
    av1_encode_intra_block_plane(cpi, x, bsize, 0, DRY_RUN_NORMAL, 0);
  int this_intra_error = aom_get_mb_ss(x->plane[0].src_diff);
  if (seq_params->use_highbitdepth) {
    switch (seq_params->bit_depth) {
      case AOM_BITS_8: break;
      case AOM_BITS_10: this_intra_error >>= 4; break;
      case AOM_BITS_12: this_intra_error >>= 8; break;
      default:
        assert(0 &&
               "seq_params->bit_depth should be AOM_BITS_8, "
               "AOM_BITS_10 or AOM_BITS_12");
        return -1;
    }
  }

  if (this_intra_error < UL_INTRA_THRESH) {
    ++stats->intra_skip_count;
  } else if ((unit_col > 0) && (stats->image_data_start_row == INVALID_ROW)) {
    stats->image_data_start_row = unit_row;
  }

  double log_intra = log1p(this_intra_error);
  if (log_intra < 10.0) {
    stats->intra_factor += 1.0 + ((10.0 - log_intra) * 0.05);
  } else {
    stats->intra_factor += 1.0;
  }

  int level_sample;
  if (seq_params->use_highbitdepth) {
    level_sample = CONVERT_TO_SHORTPTR(x->plane[0].src.buf)[0];
  } else {
    level_sample = x->plane[0].src.buf[0];
  }

  if (seq_params->use_highbitdepth) {
    switch (seq_params->bit_depth) {
      case AOM_BITS_8: break;
      case AOM_BITS_10: level_sample >>= 2; break;
      case AOM_BITS_12: level_sample >>= 4; break;
      default:
        assert(0 &&
               "seq_params->bit_depth should be AOM_BITS_8, "
               "AOM_BITS_10 or AOM_BITS_12");
        return -1;
    }
  }
  if ((level_sample < DARK_THRESH) && (log_intra < 9.0)) {
    stats->brightness_factor += 1.0 + (0.01 * (DARK_THRESH - level_sample));
  } else {
    stats->brightness_factor += 1.0;
  }

  // Intrapenalty below deals with situations where the intra and inter
  // error scores are very low (e.g. a plain black frame).
  // We do not have special cases in first pass for 0,0 and nearest etc so
  // all inter modes carry an overhead cost estimate for the mv.
  // When the error score is very low this causes us to pick all or lots of
  // INTRA modes and throw lots of key frames.
  // This penalty adds a cost matching that of a 0,0 mv to the intra case.
  this_intra_error += INTRA_MODE_PENALTY;

  // Accumulate the intra error.
  stats->intra_error += (int64_t)this_intra_error;

  // Stats based on wavelet energy is used in the following cases :
  // 1. ML model which predicts if a flat structure (golden-frame only structure
  // without ALT-REF and Internal-ARFs) is better. This ML model is enabled in
  // constant quality mode under certain conditions.
  // 2. Delta qindex mode is set as DELTA_Q_PERCEPTUAL.
  // Thus, wavelet energy calculation is enabled for the above cases.
  if (calc_wavelet_energy(&cpi->oxcf)) {
    const int hbd = is_cur_buf_hbd(xd);
    const int stride = x->plane[0].src.stride;
    const int num_8x8_rows = block_size_high[fp_block_size] / 8;
    const int num_8x8_cols = block_size_wide[fp_block_size] / 8;
    const uint8_t *buf = x->plane[0].src.buf;
    stats->frame_avg_wavelet_energy += av1_haar_ac_sad_mxn_uint8_input(
        buf, stride, hbd, num_8x8_rows, num_8x8_cols);
  } else {
    stats->frame_avg_wavelet_energy = INVALID_FP_STATS_TO_PREDICT_FLAT_GOP;
  }

  return this_intra_error;
}